

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_recv_message(Curl_easy *data,void **msg)

{
  unsigned_short uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  CURLcode result;
  size_t len;
  size_t msg_size;
  size_t nbt_size;
  ssize_t bytes_read;
  char *buf;
  smb_conn *smbc;
  connectdata *pcStack_28;
  curl_socket_t sockfd;
  connectdata *conn;
  void **msg_local;
  Curl_easy *data_local;
  
  pcStack_28 = data->conn;
  smbc._4_4_ = pcStack_28->sock[0];
  buf = (char *)&pcStack_28->proto;
  bytes_read = (pcStack_28->proto).ftpc.pp.sendleft;
  conn = (connectdata *)msg;
  msg_local = (void **)data;
  data_local._4_4_ =
       Curl_read(data,smbc._4_4_,(char *)(bytes_read + (pcStack_28->proto).ftpc.pp.response_time),
                 0x9000 - (pcStack_28->proto).httpc.binlen,(ssize_t *)&nbt_size);
  if (data_local._4_4_ == CURLE_OK) {
    if (nbt_size == 0) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      *(size_t *)(buf + 0x50) = nbt_size + *(long *)(buf + 0x50);
      if (*(ulong *)(buf + 0x50) < 4) {
        data_local._4_4_ = CURLE_OK;
      }
      else {
        uVar1 = Curl_read16_be((uchar *)(bytes_read + 2));
        uVar2 = (ulong)uVar1 + 4;
        if (*(ulong *)(buf + 0x50) < uVar2) {
          data_local._4_4_ = CURLE_OK;
        }
        else if (((uVar2 < 0x25) ||
                 (lVar3 = (ulong)*(byte *)(bytes_read + 0x24) * 2, lVar4 = lVar3 + 0x25,
                 uVar2 < lVar3 + 0x27U)) ||
                (uVar1 = Curl_read16_le((uchar *)(bytes_read + lVar4)),
                (ulong)uVar1 + 2 + lVar4 <= uVar2)) {
          *(ssize_t *)&conn->cnnct = bytes_read;
          data_local._4_4_ = CURLE_OK;
        }
        else {
          data_local._4_4_ = CURLE_READ_ERROR;
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_recv_message(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  struct smb_conn *smbc = &conn->proto.smbc;
  char *buf = smbc->recv_buf;
  ssize_t bytes_read;
  size_t nbt_size;
  size_t msg_size;
  size_t len = MAX_MESSAGE_SIZE - smbc->got;
  CURLcode result;

  result = Curl_read(data, sockfd, buf + smbc->got, len, &bytes_read);
  if(result)
    return result;

  if(!bytes_read)
    return CURLE_OK;

  smbc->got += bytes_read;

  /* Check for a 32-bit nbt header */
  if(smbc->got < sizeof(unsigned int))
    return CURLE_OK;

  nbt_size = Curl_read16_be((const unsigned char *)
                            (buf + sizeof(unsigned short))) +
    sizeof(unsigned int);
  if(smbc->got < nbt_size)
    return CURLE_OK;

  msg_size = sizeof(struct smb_header);
  if(nbt_size >= msg_size + 1) {
    /* Add the word count */
    msg_size += 1 + ((unsigned char) buf[msg_size]) * sizeof(unsigned short);
    if(nbt_size >= msg_size + sizeof(unsigned short)) {
      /* Add the byte count */
      msg_size += sizeof(unsigned short) +
        Curl_read16_le((const unsigned char *)&buf[msg_size]);
      if(nbt_size < msg_size)
        return CURLE_READ_ERROR;
    }
  }

  *msg = buf;

  return CURLE_OK;
}